

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Type::Deserialize(Type *this,Parser *parser,Type *type)

{
  uint16_t uVar1;
  BaseType BVar2;
  BaseType BVar3;
  char *pcVar4;
  size_type_conflict sVar5;
  const_reference ppSVar6;
  const_reference ppEVar7;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar8;
  int __c_00;
  int __c_01;
  Parser *__s;
  bool bVar9;
  bool is_series;
  Type *type_local;
  Parser *parser_local;
  Type *this_local;
  
  if (type == (Type *)0x0) {
    return true;
  }
  __s = parser;
  BVar2 = reflection::Type::base_type(type);
  this->base_type = BVar2;
  BVar2 = reflection::Type::element(type);
  this->element = BVar2;
  uVar1 = reflection::Type::fixed_length(type);
  this->fixed_length = uVar1;
  pcVar4 = reflection::Type::index(type,(char *)__s,__c);
  if (-1 < (int)pcVar4) {
    BVar3 = reflection::Type::base_type(type);
    bVar9 = true;
    if (BVar3 != Vector) {
      BVar3 = reflection::Type::base_type(type);
      bVar9 = BVar3 == Array;
    }
    BVar3 = reflection::Type::base_type(type);
    iVar8 = extraout_EDX;
    if ((BVar3 == Obj) ||
       ((bVar9 && (BVar3 = reflection::Type::element(type), iVar8 = extraout_EDX_00, BVar3 == Obj)))
       ) {
      pcVar4 = reflection::Type::index(type,(char *)__s,iVar8);
      sVar5 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::size
                        (&(parser->structs_).vec);
      if (sVar5 <= (ulong)(long)(int)pcVar4) {
        return false;
      }
      pcVar4 = reflection::Type::index(type,(char *)__s,__c_00);
      ppSVar6 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                operator[](&(parser->structs_).vec,(long)(int)pcVar4);
      this->struct_def = *ppSVar6;
      (this->struct_def->super_Definition).refcount =
           (this->struct_def->super_Definition).refcount + 1;
    }
    else {
      pcVar4 = reflection::Type::index(type,(char *)__s,iVar8);
      sVar5 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::size
                        (&(parser->enums_).vec);
      if (sVar5 <= (ulong)(long)(int)pcVar4) {
        return false;
      }
      pcVar4 = reflection::Type::index(type,(char *)__s,__c_01);
      ppEVar7 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::
                operator[](&(parser->enums_).vec,(long)(int)pcVar4);
      this->enum_def = *ppEVar7;
    }
  }
  return true;
}

Assistant:

bool Type::Deserialize(const Parser &parser, const reflection::Type *type) {
  if (type == nullptr) return true;
  base_type = static_cast<BaseType>(type->base_type());
  element = static_cast<BaseType>(type->element());
  fixed_length = type->fixed_length();
  if (type->index() >= 0) {
    bool is_series = type->base_type() == reflection::Vector ||
                     type->base_type() == reflection::Array;
    if (type->base_type() == reflection::Obj ||
        (is_series && type->element() == reflection::Obj)) {
      if (static_cast<size_t>(type->index()) < parser.structs_.vec.size()) {
        struct_def = parser.structs_.vec[type->index()];
        struct_def->refcount++;
      } else {
        return false;
      }
    } else {
      if (static_cast<size_t>(type->index()) < parser.enums_.vec.size()) {
        enum_def = parser.enums_.vec[type->index()];
      } else {
        return false;
      }
    }
  }
  return true;
}